

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specreaderimpl.cpp
# Opt level: O0

bool apngasm::spec::priv::anon_unknown_0::str2delay(string *str,Delay *pOut)

{
  _Alloc_hider *p_Var1;
  Delay *this;
  bool bVar2;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  string *den;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string *num;
  size_type index;
  Delay *pOut_local;
  string *str_local;
  
  if (pOut == (Delay *)0x0) {
    str_local._7_1_ = 0;
  }
  else {
    index = (size_type)pOut;
    pOut_local = (Delay *)str;
    num = (string *)
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (str,'/',0);
    if (num == (string *)0xffffffffffffffff) {
      bVar2 = s2u((string *)pOut_local,(uint *)index);
      if (!bVar2) {
        str_local._7_1_ = 0;
        goto LAB_00214650;
      }
      *(undefined4 *)(index + 4) = 1000;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&den,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOut_local,0,
                 (size_type)num);
      this = pOut_local;
      p_Var1 = &num->_M_dataplus;
      local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&den;
      __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       pOut_local);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                 ,(size_type)((long)&p_Var1->_M_p + 1),__n);
      local_58 = &local_78;
      bVar2 = s2u(local_30,(uint *)index);
      if ((bVar2) && (bVar2 = s2u(local_58,(uint *)(index + 4)), bVar2)) {
        bVar2 = false;
      }
      else {
        str_local._7_1_ = 0;
        bVar2 = true;
      }
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&den);
      if (bVar2) goto LAB_00214650;
    }
    str_local._7_1_ = 1;
  }
LAB_00214650:
  return (bool)(str_local._7_1_ & 1);
}

Assistant:

bool str2delay(const std::string& str, Delay* pOut)
        {
          if(pOut == NULL)
            return false;

          static const char delimiter = '/';
          const std::string::size_type index = str.find(delimiter, 0);

          // Numerator only.
          if(index == std::string::npos)
          {
            if( !s2u(str, &pOut->num) )
              return false;
            pOut->den = DEFAULT_FRAME_DENOMINATOR;
          }

          // Numerator / Denominator
          else
          {
            const std::string& num = str.substr(0, index);
            const std::string& den = str.substr(index+1, str.length());

            if( !s2u(num, &pOut->num) || !s2u(den, &pOut->den) )
              return false;
          }

          return true;
        }